

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

ObjectComprehension * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::ObjectComprehension>
          (Allocator *this,ObjectComprehension *ast)

{
  ObjectComprehension *this_00;
  ObjectComprehension *local_20;
  
  this_00 = (ObjectComprehension *)operator_new(0xd0);
  ObjectComprehension::ObjectComprehension(this_00,ast);
  local_20 = this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,(value_type *)&local_20);
  return this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }